

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

void skipdata_opstr(char *opstr,uint8_t *buffer,size_t size)

{
  int iVar1;
  ulong local_38;
  size_t i;
  char *pcStack_28;
  int len;
  char *p;
  size_t size_local;
  uint8_t *buffer_local;
  char *opstr_local;
  
  if (size == 0) {
    *opstr = '\0';
  }
  else {
    iVar1 = sprintf(opstr,"0x%02x",(ulong)*buffer);
    pcStack_28 = opstr + iVar1;
    for (local_38 = 1; local_38 < size; local_38 = local_38 + 1) {
      iVar1 = sprintf(pcStack_28,", 0x%02x",(ulong)buffer[local_38]);
      pcStack_28 = pcStack_28 + iVar1;
    }
  }
  return;
}

Assistant:

static void skipdata_opstr(char *opstr, const uint8_t *buffer, size_t size)
{
	char *p = opstr;
	int len;
	size_t i;

	if (!size) {
		opstr[0] = '\0';
		return;
	}

	len = sprintf(p, "0x%02x", buffer[0]);
	p+= len;

	for(i = 1; i < size; i++) {
		len = sprintf(p, ", 0x%02x", buffer[i]);
		p+= len;
	}
}